

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper-inl.h
# Opt level: O0

void __thiscall spdlog::details::file_helper::reopen(file_helper *this,bool truncate)

{
  byte bVar1;
  bool bVar2;
  byte in_SIL;
  file_helper *in_RDI;
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff0;
  
  bVar1 = in_SIL & 1;
  bVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6e0a15);
  if (!bVar2) {
    open(in_RDI,(char *)&in_RDI->filename_,(uint)(bVar1 & 1));
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(bVar1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8,
             in_stack_ffffffffffffffe0);
  throw_spdlog_ex((string *)CONCAT17(bVar1,in_stack_fffffffffffffff0));
}

Assistant:

SPDLOG_INLINE void file_helper::reopen(bool truncate) {
    if (filename_.empty()) {
        throw_spdlog_ex("Failed re opening file - was not opened before");
    }
    this->open(filename_, truncate);
}